

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_twod_node(REF_NODE ref_node)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  REF_DBL local_58 [2];
  undefined8 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar1 = ref_node->max;
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      if (-1 < ref_node->global[lVar5]) {
        uVar2 = ref_node_metric_get(ref_node,(REF_INT)lVar5,local_58);
        if (uVar2 != 0) {
          pcVar4 = "get";
          uVar3 = 0x18c;
LAB_001c17f4:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar3,"ref_metric_twod_node",(ulong)uVar2,pcVar4);
          return uVar2;
        }
        local_48 = 0;
        local_38 = 0;
        uStack_30 = 0x3ff0000000000000;
        uVar2 = ref_node_metric_set(ref_node,(REF_INT)lVar5,local_58);
        if (uVar2 != 0) {
          pcVar4 = "set";
          uVar3 = 400;
          goto LAB_001c17f4;
        }
        iVar1 = ref_node->max;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_twod_node(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL m[6];

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    m[2] = 0.0;
    m[4] = 0.0;
    m[5] = 1.0;
    RSS(ref_node_metric_set(ref_node, node, m), "set");
  }

  return REF_SUCCESS;
}